

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::duplicate_contents(Tree *this,Tree *src,size_t node,size_t where)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t in_stack_00000050;
  size_t in_stack_00000058;
  size_t in_stack_00000060;
  Tree *in_stack_00000068;
  Tree *in_stack_00000070;
  char msg_2 [30];
  char msg_1 [29];
  char msg [31];
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  Tree *in_stack_fffffffffffffea0;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  char local_e8 [40];
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  char local_98 [40];
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  char *local_50;
  char local_48 [40];
  long local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (in_RSI == 0) {
    builtin_strncpy(local_48,"check failed: (src != nullptr)",0x1f);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location((Location *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    (*pcVar1)(local_48,0x1f,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe78 = local_70;
    in_stack_fffffffffffffe7c = uStack_6c;
    in_stack_fffffffffffffe80 = uStack_68;
    in_stack_fffffffffffffe84 = uStack_64;
    in_stack_fffffffffffffe88 = local_60;
    in_stack_fffffffffffffe8c = uStack_5c;
    in_stack_fffffffffffffe90 = uStack_58;
    in_stack_fffffffffffffe94 = uStack_54;
    in_stack_fffffffffffffe98 = local_50;
  }
  if (local_18 == -1) {
    builtin_strncpy(local_98,"check failed: (node != NONE)",0x1d);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location((Location *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    (*pcVar1)(local_98,0x1d,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe78 = local_c0;
    in_stack_fffffffffffffe7c = uStack_bc;
    in_stack_fffffffffffffe80 = uStack_b8;
    in_stack_fffffffffffffe84 = uStack_b4;
    in_stack_fffffffffffffe88 = local_b0;
    in_stack_fffffffffffffe8c = uStack_ac;
    in_stack_fffffffffffffe90 = uStack_a8;
    in_stack_fffffffffffffe94 = uStack_a4;
    in_stack_fffffffffffffe98 = local_a0;
  }
  if (local_20 == -1) {
    builtin_strncpy(local_e8,"check failed: (where != NONE)",0x1e);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location((Location *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    (*pcVar1)(local_e8,0x1e,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe78 = local_110;
    in_stack_fffffffffffffe7c = uStack_10c;
    in_stack_fffffffffffffe80 = uStack_108;
    in_stack_fffffffffffffe84 = uStack_104;
    in_stack_fffffffffffffe88 = local_100;
    in_stack_fffffffffffffe8c = uStack_fc;
    in_stack_fffffffffffffe90 = uStack_f8;
    in_stack_fffffffffffffe94 = uStack_f4;
    in_stack_fffffffffffffe98 = local_f0;
  }
  _copy_props_wo_key(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98,
                     (Tree *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  last_child((Tree *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  duplicate_children(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                     in_stack_00000050);
  return;
}

Assistant:

void Tree::duplicate_contents(Tree const *src, size_t node, size_t where)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, where != NONE);
    _copy_props_wo_key(where, src, node);
    duplicate_children(src, node, where, last_child(where));
}